

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixy-pktgen.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint8_t *puVar1;
  ulong uVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  uint32_t cs;
  uint uVar6;
  long lVar7;
  int buf_id;
  long lVar8;
  ulong uVar9;
  uint32_t num_sent;
  ulong uVar10;
  long local_4288 [63];
  undefined8 uStack_4090;
  long lStack_4088;
  device_stats stats_old;
  undefined1 auStack_80 [8];
  device_stats stats;
  long local_40;
  ulong local_38;
  
  if (argc == 2) {
    uStack_4090 = 0x1011ea;
    uVar4 = memory_allocate_mempool(0x800,0);
    uStack_4090 = 0x27;
    for (lVar8 = 0; lVar8 != 0x800; lVar8 = lVar8 + 1) {
      uStack_4090 = 0x10120b;
      lVar5 = pkt_buf_alloc(uVar4);
      *(undefined4 *)(lVar5 + 0x14) = 0x3c;
      builtin_memcpy((uint8_t *)(lVar5 + 0x40),"\x01\x02\x03\x04\x05\x06\x11\x12",8);
      puVar1 = (uint8_t *)(lVar5 + 0x48);
      builtin_memcpy(puVar1,"\x13\x14\x15\x16\b",6);
      puVar1[6] = 'E';
      puVar1[7] = '\0';
      puVar1 = (uint8_t *)(lVar5 + 0x50);
      puVar1[0] = '\0';
      puVar1[1] = '.';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '@';
      puVar1[7] = '\x11';
      puVar1 = (uint8_t *)(lVar5 + 0x58);
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\n';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\x01';
      puVar1[6] = '\n';
      puVar1[7] = '\0';
      puVar1 = (uint8_t *)(lVar5 + 0x4d);
      puVar1[0] = '\0';
      puVar1[1] = 'E';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '.';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      puVar1 = (uint8_t *)(lVar5 + 0x55);
      puVar1[0] = '\0';
      puVar1[1] = '@';
      puVar1[2] = '\x11';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\n';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      puVar1 = (uint8_t *)(lVar5 + 0x5d);
      puVar1[0] = '\x01';
      puVar1[1] = '\n';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\x02';
      puVar1[5] = '\0';
      puVar1[6] = '*';
      puVar1[7] = '\x05';
      puVar1 = (uint8_t *)(lVar5 + 0x65);
      puVar1[0] = '9';
      puVar1[1] = '\0';
      puVar1[2] = '\x1a';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = 'i';
      puVar1[6] = 'x';
      puVar1[7] = 'y';
      uVar6 = 0;
      for (lVar7 = 0x27; lVar7 != 0x31; lVar7 = lVar7 + 1) {
        uVar6 = uVar6 + *(ushort *)(lVar5 + lVar7 * 2);
        if (0xffff < uVar6) {
          uVar6 = (uVar6 & 0xffff) + 1;
        }
      }
      *(ushort *)(lVar5 + 0x58) = ~(ushort)uVar6;
      (&lStack_4088)[lVar8] = lVar5;
    }
    for (lVar8 = 0; lVar8 != 0x800; lVar8 = lVar8 + 1) {
      uStack_4090 = 0x1012a1;
      pkt_buf_free((&lStack_4088)[lVar8]);
    }
    uStack_4090 = 0x1012b7;
    lVar8 = ixy_init(argv[1],1);
    uStack_4090 = 0x1012c1;
    local_40 = monotonic_time();
    uStack_4090 = 0x1012d1;
    stats_init(auStack_80,lVar8);
    uStack_4090 = 0x1012e0;
    stats_init(&lStack_4088,lVar8);
    uVar9 = 0;
    local_38 = 0;
    do {
      pkt_buf_alloc_batch(uVar4,local_4288,0x40);
      stats.tx_bytes = uVar9 & 0xffffffff;
      for (lVar7 = 0; uVar9 = stats.tx_bytes + lVar7, lVar7 != 0x40; lVar7 = lVar7 + 1) {
        *(int *)(local_4288[lVar7] + 0x78) = (int)uVar9;
      }
      uVar10 = 0;
      do {
        iVar3 = (**(code **)(lVar8 + 0x20))(lVar8,0,local_4288 + uVar10,0x40 - (int)uVar10);
        uVar6 = (int)uVar10 + iVar3;
        uVar10 = (ulong)uVar6;
      } while (uVar6 != 0x40);
      uVar10 = local_38 + 1;
      uVar2 = local_38 & 0xfff;
      local_38 = uVar10;
      if (uVar2 == 0) {
        lVar7 = monotonic_time();
        if (1000000000 < (ulong)(lVar7 - local_40)) {
          (**(code **)(lVar8 + 0x28))(lVar8,auStack_80);
          print_stats_diff(auStack_80,&lStack_4088,lVar7 - local_40);
          uVar9 = (ulong)((int)stats.tx_bytes + 0x40);
          local_40 = lVar7;
        }
      }
    } while( true );
  }
  uStack_4090 = 0x101274;
  printf("Usage: %s <pci bus id>\n",*argv);
  return 1;
}

Assistant:

int main(int argc, char* argv[]) {
	if (argc != 2) {
		printf("Usage: %s <pci bus id>\n", argv[0]);
		return 1;
	}

	struct mempool* mempool = init_mempool();
	struct ixy_device* dev = ixy_init(argv[1], 1, 1);

	uint64_t last_stats_printed = monotonic_time();
	uint64_t counter = 0;
	struct device_stats stats_old, stats;
	stats_init(&stats, dev);
	stats_init(&stats_old, dev);
	uint32_t seq_num = 0;

	// array of bufs sent out in a batch
	struct pkt_buf* bufs[BATCH_SIZE];

	// tx loop
	while (true) {
		// we cannot immediately recycle packets, we need to allocate new packets every time
		// the old packets might still be used by the NIC: tx is async
		pkt_buf_alloc_batch(mempool, bufs, BATCH_SIZE);
		for (uint32_t i = 0; i < BATCH_SIZE; i++) {
			// packets can be modified here, make sure to update the checksum when changing the IP header
			*(uint32_t*)(bufs[i]->data + PKT_SIZE - 4) = seq_num++;
		}
		// the packets could be modified here to generate multiple flows
		ixy_tx_batch_busy_wait(dev, 0, bufs, BATCH_SIZE);

		// don't check time for every packet, this yields +10% performance :)
		if ((counter++ & 0xFFF) == 0) {
			uint64_t time = monotonic_time();
			if (time - last_stats_printed > 1000 * 1000 * 1000) {
				// every second
				ixy_read_stats(dev, &stats);
				print_stats_diff(&stats, &stats_old, time - last_stats_printed);
				stats_old = stats;
				last_stats_printed = time;
			}
		}
		// track stats
	}
	return 0;
}